

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::insert_copy_after(xml_node *this,xml_attribute *proto,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute xVar4;
  xml_attribute_struct *pxVar5;
  uint uVar6;
  xml_attribute_struct *pxVar7;
  xml_attribute_struct **ppxVar8;
  xml_attribute a;
  xml_attribute local_30;
  xml_attribute local_28;
  
  if ((((proto->_attr == (xml_attribute_struct *)0x0) ||
       (pxVar2 = this->_root, pxVar2 == (xml_node_struct *)0x0)) ||
      ((uVar6 = (uint)pxVar2->header & 0xf, uVar6 != 2 && (uVar6 != 7)))) ||
     (attr->_attr == (xml_attribute_struct *)0x0)) goto LAB_001901bc;
  ppxVar8 = &pxVar2->first_attribute;
  do {
    pxVar5 = *ppxVar8;
    if (pxVar5 == attr->_attr) break;
    ppxVar8 = &pxVar5->next_attribute;
  } while (pxVar5 != (xml_attribute_struct *)0x0);
  if (pxVar5 == (xml_attribute_struct *)0x0) goto LAB_001901bc;
  if (pxVar2 == (xml_node_struct *)0x0) {
    __assert_fail("object",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x49b,
                  "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                 );
  }
  this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
  uVar1 = this_00->_busy_size + 0x28;
  if (uVar1 < 0x7fd9) {
    pxVar5 = (xml_attribute_struct *)((long)&this_00->_root[1].allocator + this_00->_busy_size);
    this_00->_busy_size = uVar1;
    xVar4._attr = (xml_attribute_struct *)this_00->_root;
LAB_00190154:
    pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
    pxVar5->next_attribute = (xml_attribute_struct *)0x0;
    pxVar5->name = (char_t *)0x0;
    pxVar5->value = (char_t *)0x0;
    pxVar5->header = ((long)pxVar5 - (long)xVar4._attr) * 0x100;
  }
  else {
    pxVar5 = (xml_attribute_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this_00,0x28,(xml_memory_page **)&local_28);
    xVar4._attr = local_28._attr;
    if (pxVar5 != (xml_attribute_struct *)0x0) goto LAB_00190154;
    pxVar5 = (xml_attribute_struct *)0x0;
  }
  xml_attribute::xml_attribute(&local_28,pxVar5);
  if ((xml_memory_page *)local_28._attr != (xml_memory_page *)0x0) {
    pxVar5 = attr->_attr;
    pxVar3 = pxVar5->next_attribute;
    pxVar7 = pxVar3;
    if (pxVar3 == (xml_attribute_struct *)0x0) {
      pxVar7 = this->_root->first_attribute;
    }
    pxVar7->prev_attribute_c = local_28._attr;
    (local_28._attr)->next_attribute = pxVar3;
    (local_28._attr)->prev_attribute_c = pxVar5;
    pxVar5->next_attribute = local_28._attr;
    impl::anon_unknown_0::node_copy_attribute(local_28._attr,proto->_attr);
    return (xml_attribute)local_28._attr;
  }
LAB_001901bc:
  xml_attribute::xml_attribute(&local_30);
  return (xml_attribute)local_30._attr;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}